

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.cpp
# Opt level: O3

int __thiscall
String::clone(String *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  _func_int **pp_Var1;
  
  pp_Var1 = (_func_int **)operator_new(0x30);
  *(undefined4 *)(pp_Var1 + 1) = 3;
  *pp_Var1 = (_func_int *)&PTR__String_00150bf0;
  pp_Var1[2] = (_func_int *)(pp_Var1 + 4);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pp_Var1 + 2),*(long *)(__fn + 0x10),
             *(long *)(__fn + 0x18) + *(long *)(__fn + 0x10));
  (this->super_Value)._vptr_Value = pp_Var1;
  return (int)this;
}

Assistant:

std::unique_ptr<Value> String::clone() const
{
  return std::make_unique<String>(value_);
}